

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_unix.cpp
# Opt level: O2

TriStateResult __thiscall QFSFileEngine::cloneTo(QFSFileEngine *this,QAbstractFileEngine *target)

{
  QFSFileEnginePrivate *this_00;
  TriStateResult TVar1;
  uint uVar2;
  int srcfd;
  int dstfd;
  int *piVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QFSFileEnginePrivate *)(this->super_QAbstractFileEngine).d_ptr.d;
  uVar2 = (*target->_vptr_QAbstractFileEngine[0x16])(target,0x200000);
  TVar1 = NotSupported;
  if ((uVar2 >> 0x15 & 1) != 0) {
    srcfd = QFSFileEnginePrivate::nativeHandle(this_00);
    dstfd = (*target->_vptr_QAbstractFileEngine[0x1f])(target);
    TVar1 = QFileSystemEngine::cloneFile(srcfd,dstfd,&this_00->metaData);
    if (TVar1 == Failed) {
      piVar3 = __errno_location();
      qt_error_string((QString *)&local_40,*piVar3);
      QAbstractFileEngine::setError(&this->super_QAbstractFileEngine,CopyError,(QString *)&local_40)
      ;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
      TVar1 = Failed;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return TVar1;
  }
  __stack_chk_fail();
}

Assistant:

QAbstractFileEngine::TriStateResult QFSFileEngine::cloneTo(QAbstractFileEngine *target)
{
    Q_D(QFSFileEngine);
    if ((target->fileFlags(LocalDiskFlag) & LocalDiskFlag) == 0)
        return TriStateResult::NotSupported;

    int srcfd = d->nativeHandle();
    int dstfd = target->handle();
    TriStateResult r = QFileSystemEngine::cloneFile(srcfd, dstfd, d->metaData);
    if (r == TriStateResult::Failed)
        setError(QFile::CopyError, qt_error_string(errno));
    return r;
}